

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

void __thiscall kj::anon_unknown_77::AsyncTee::removeBranch(AsyncTee *this,BranchId branch)

{
  bool bVar1;
  Branch **ppBVar2;
  Fault local_50;
  Fault f;
  Fault local_30;
  Branch *local_28;
  Branch *_kj_result;
  Branch *state;
  AsyncTee *pAStack_10;
  BranchId branch_local;
  AsyncTee *this_local;
  
  state._4_4_ = branch;
  pAStack_10 = this;
  local_28 = _::readMaybe<kj::(anonymous_namespace)::AsyncTee::Branch>(this->branches + branch);
  if (local_28 == (Branch *)0x0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[29]>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x4c6,FAILED,"branches[branch] != nullptr","\"branch was already destroyed\"",
               (char (*) [29])"branch was already destroyed");
    _::Debug::Fault::fatal(&local_30);
  }
  ppBVar2 = mv<kj::(anonymous_namespace)::AsyncTee::Branch*>(&local_28);
  f.exception = (Exception *)*ppBVar2;
  _kj_result = (Branch *)f.exception;
  bVar1 = Maybe<kj::(anonymous_namespace)::AsyncTee::Sink_&>::operator==
                    ((Maybe<kj::(anonymous_namespace)::AsyncTee::Sink_&> *)(f.exception)->trace,
                     (void *)0x0);
  if (!bVar1) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[83]>
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x4c8,FAILED,"state.sink == nullptr",
               "\"destroying tee branch with operation still in-progress; probably going to segfault\""
               ,(char (*) [83])
                "destroying tee branch with operation still in-progress; probably going to segfault"
              );
    _::Debug::Fault::~Fault(&local_50);
  }
  Maybe<kj::(anonymous_namespace)::AsyncTee::Branch>::operator=
            (this->branches + state._4_4_,(void *)0x0);
  return;
}

Assistant:

void removeBranch(BranchId branch) {
    auto& state = KJ_REQUIRE_NONNULL(branches[branch], "branch was already destroyed");
    KJ_REQUIRE(state.sink == nullptr,
        "destroying tee branch with operation still in-progress; probably going to segfault") {
      // Don't std::terminate().
      break;
    }

    branches[branch] = nullptr;
  }